

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O0

shared_ptr<AvlTree<int>::Node> __thiscall
AvlTree<int>::_rightRotate(AvlTree<int> *this,shared_ptr<AvlTree<int>::Node> *node)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  int *piVar4;
  __shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<AvlTree<int>::Node> sVar6;
  shared_ptr<const_AvlTree<int>::Node> local_d8;
  shared_ptr<const_AvlTree<int>::Node> local_c8;
  shared_ptr<const_AvlTree<int>::Node> local_b8;
  int local_a4;
  shared_ptr<const_AvlTree<int>::Node> local_a0;
  int local_8c;
  shared_ptr<const_AvlTree<int>::Node> local_88;
  shared_ptr<const_AvlTree<int>::Node> local_78;
  shared_ptr<const_AvlTree<int>::Node> local_68;
  int local_54;
  shared_ptr<const_AvlTree<int>::Node> local_50;
  int local_3c;
  undefined1 local_38 [8];
  shared_ptr<AvlTree<int>::Node> T2;
  shared_ptr<AvlTree<int>::Node> *node_local;
  AvlTree<int> *this_local;
  shared_ptr<AvlTree<int>::Node> *x;
  
  T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node>::shared_ptr(&this->m_Root,&peVar3->left);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node>::shared_ptr
            ((shared_ptr<AvlTree<int>::Node> *)local_38,&peVar3->right);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node>::operator=
            (&peVar3->right,(shared_ptr<AvlTree<int>::Node> *)in_RDX);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node>::operator=
            (&peVar3->left,(shared_ptr<AvlTree<int>::Node> *)local_38);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_50,&peVar3->left);
  local_3c = _height((AvlTree<int> *)node,&local_50);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_68,&peVar3->right);
  local_54 = _height((AvlTree<int> *)node,&local_68);
  piVar4 = std::max<int>(&local_3c,&local_54);
  iVar1 = *piVar4;
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  peVar3->height = iVar1 + 1;
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_68);
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_50);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_78,&peVar3->left);
  iVar1 = _size((AvlTree<int> *)node,&local_78);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_88,&peVar3->right);
  iVar2 = _size((AvlTree<int> *)node,&local_88);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  peVar3->size = iVar1 + iVar2 + 1;
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_88);
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_78);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_a0,&peVar3->left);
  local_8c = _height((AvlTree<int> *)node,&local_a0);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_b8,&peVar3->right);
  local_a4 = _height((AvlTree<int> *)node,&local_b8);
  piVar4 = std::max<int>(&local_8c,&local_a4);
  iVar1 = *piVar4;
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3->height = iVar1 + 1;
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_b8);
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_a0);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_c8,&peVar3->left);
  iVar1 = _size((AvlTree<int> *)node,&local_c8);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<AvlTree<int>::Node_const>::shared_ptr<AvlTree<int>::Node,void>
            ((shared_ptr<AvlTree<int>::Node_const> *)&local_d8,&peVar3->right);
  iVar2 = _size((AvlTree<int> *)node,&local_d8);
  peVar3 = std::__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3->size = iVar1 + iVar2 + 1;
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_d8);
  std::shared_ptr<const_AvlTree<int>::Node>::~shared_ptr(&local_c8);
  T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<AvlTree<int>::Node>::~shared_ptr((shared_ptr<AvlTree<int>::Node> *)local_38);
  _Var5._M_pi = extraout_RDX;
  if ((T2.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
      & 1) == 0) {
    std::shared_ptr<AvlTree<int>::Node>::~shared_ptr(&this->m_Root);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<int>::Node>)
         sVar6.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _rightRotate(std::shared_ptr<Node>& node)
    {
        auto x = node->left;
        auto T2 = x->right;

        // Perform rotation
        x->right = node;
        node->left = T2;

        // Update node values
        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        x->height = std::max(_height(x->left), _height(x->right)) + 1;
        x->size = _size(x->left) + _size(x->right) + 1;

        // Return new root
        return x;
    }